

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O1

TPZCompEl * __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_>::Clone
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_> *this,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapePiram> *this_00;
  
  this_00 = (TPZCompElH1<pzshape::TPZShapePiram> *)operator_new(0x110);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapePiram>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_019a3030;
  TPZCompElH1<pzshape::TPZShapePiram>::TPZCompElH1
            (this_00,&PTR_PTR_01999f60,mesh,&this->super_TPZCompElH1<pzshape::TPZShapePiram>);
  *(undefined8 *)
   &this_00[1].super_TPZIntelGen<pzshape::TPZShapePiram>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0;
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapePiram>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_01999b90;
  return (TPZCompEl *)this_00;
}

Assistant:

inline TPZCompEl * TPZCompElPostProc<TCOMPEL>::Clone(TPZCompMesh &mesh) const{
    return new TPZCompElPostProc<TCOMPEL> (mesh, *this);
}